

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

sendContext * __thiscall
hwnet::sendContextPool::get(sendContextPool *this,int fd,Ptr *buff,size_t len)

{
  pthread_mutex_t *__mutex;
  sendContext *this_00;
  int iVar1;
  
  iVar1 = fd % 0x101;
  __mutex = (pthread_mutex_t *)(this->pools + iVar1);
  std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = this->pools[iVar1].head;
  if (this_00 == (sendContext *)0x0) {
    this_00 = (sendContext *)malloc(0x30);
    TCPSocket::sendContext::sendContext(this_00,buff,len);
  }
  else {
    __mutex[1].__data.__lock = __mutex[1].__data.__lock + -1;
    *(sendContext **)((long)__mutex + 0x30) = this_00->next;
    TCPSocket::sendContext::sendContext(this_00,buff,len);
  }
  this_00->poolIndex = iVar1;
  pthread_mutex_unlock(__mutex);
  return this_00;
}

Assistant:

TCPSocket::sendContext* get(int fd,const Buffer::Ptr &buff,size_t len) {
		auto index = fd%poolCount;
		pool &p = this->pools[index]; 
		std::lock_guard<std::mutex> guard(p.mtx);
		if(nullptr == p.head) {
			auto m = malloc(sizeof(TCPSocket::sendContext));
			auto s = new(m)TCPSocket::sendContext(buff,len);
			s->poolIndex = index;
			return s;
		} else {
			--p.count;
			auto s = p.head;
			p.head = p.head->next;
			s = new(s)TCPSocket::sendContext(buff,len);
			s->poolIndex = index;
			return s;
		}
	}